

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint * __thiscall PrimitiveTestClass::FillValues<unsigned_int*>(PrimitiveTestClass *this)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)this->SIZE;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = lVar3 * 4;
  }
  puVar1 = (uint *)operator_new__(uVar4);
  if (lVar3 != 0) {
    lVar2 = 0;
    do {
      puVar1[lVar2] = 0xff;
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  return puVar1;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }